

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  undefined1 *puVar11;
  int iVar12;
  char *z;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 local_68 [12];
  int iStack_5c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  double local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  byte bVar2;
  char cVar3;
  char cVar4;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = -NAN;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar12 = isDate(context,argc,argv,(DateTime *)local_68);
  if (iVar12 == 0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    computeYMD((DateTime *)local_68);
    puVar11 = uStack_30;
    uVar7 = -local_68._8_4_;
    if (0 < (int)local_68._8_4_) {
      uVar7 = local_68._8_4_;
    }
    cVar8 = (char)(iStack_5c / 10);
    cVar9 = (char)((int)local_58 / 10);
    auVar13._0_4_ = (uVar7 / 1000) % 10;
    auVar13._4_4_ = (uVar7 / 100) % 10;
    auVar13._8_4_ = (uVar7 / 10) % 10;
    auVar13._12_4_ = uVar7 % 10;
    auVar13 = auVar13 & _DAT_0020b3b0;
    uVar5 = auVar13._0_2_;
    bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * auVar13[0] - (0xff < uVar5);
    uVar5 = auVar13._4_2_;
    bVar2 = (uVar5 != 0) * (uVar5 < 0x100) * auVar13[4] - (0xff < uVar5);
    sVar6 = auVar13._8_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar13[8] - (0xff < sVar6);
    sVar6 = auVar13._10_2_;
    sVar10 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar13[10] - (0xff < sVar6),cVar3);
    sVar6 = auVar13._12_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar13[0xc] - (0xff < sVar6);
    sVar6 = auVar13._14_2_;
    sVar6 = (short)(CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar13[0xe] - (0xff < sVar6),
                             CONCAT12(cVar4,sVar10)) >> 0x10);
    local_38 = (undefined1 *)
               CONCAT17((char)((ulong)stack0xffffffffffffffa0 >> 0x20) + cVar8 * -10 + '0',
                        CONCAT16(cVar8 + (char)((iStack_5c / 10) / 10) * -10 + '0',
                                 CONCAT15(0x2d,CONCAT41(CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                                 cVar4 - (0xff < sVar6),
                                                                 CONCAT12((0 < sVar10) *
                                                                          (sVar10 < 0x100) * cVar3 -
                                                                          (0xff < sVar10),
                                                                          CONCAT11((bVar2 != 0) *
                                                                                   (bVar2 < 0x100) *
                                                                                   bVar2 - (0xff < 
                                                  bVar2),(bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                                         (0xff < bVar1)))) | (uint)DAT_0020b3c0,
                                                  (char)local_38))));
    uStack_30._4_4_ = SUB84(puVar11,4);
    uStack_30._0_4_ =
         (uint)CONCAT12((char)local_58 + cVar9 * -10 + '0',
                        CONCAT11(cVar9 + (char)(((int)local_58 / 10) / 10) * -10 + '0',0x2d));
    if ((int)local_68._8_4_ < 0) {
      z = (char *)&local_38;
      local_38 = (undefined1 *)CONCAT71(local_38._1_7_,0x2d);
      iVar12 = 0xb;
    }
    else {
      z = (char *)((long)&local_38 + 1);
      iVar12 = 10;
    }
    setResultStrOrError(context,z,iVar12,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}